

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keysections.cpp
# Opt level: O3

void M_SaveCustomKeys(FConfigFile *config,char *section,char *subsection,size_t sublen)

{
  ulong uVar1;
  long lVar2;
  
  if (KeySections.Count != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      mysnprintf(subsection,sublen,"%s.Bindings");
      DoSaveKeys(config,section,(FKeySection *)((long)&((KeySections.Array)->mTitle).Chars + lVar2),
                 false);
      mysnprintf(subsection,sublen,"%s.DoubleBindings",
                 *(undefined8 *)((long)&((KeySections.Array)->mSection).Chars + lVar2));
      DoSaveKeys(config,section,(FKeySection *)((long)&((KeySections.Array)->mTitle).Chars + lVar2),
                 true);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar1 < KeySections.Count);
  }
  return;
}

Assistant:

void M_SaveCustomKeys (FConfigFile *config, char *section, char *subsection, size_t sublen)
{
	for (unsigned i=0; i<KeySections.Size(); i++)
	{
		mysnprintf (subsection, sublen, "%s.Bindings", KeySections[i].mSection.GetChars());
		DoSaveKeys (config, section, &KeySections[i], false);
		mysnprintf (subsection, sublen, "%s.DoubleBindings", KeySections[i].mSection.GetChars());
		DoSaveKeys (config, section, &KeySections[i], true);
	}
}